

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<long> * __thiscall TPZVec<long>::operator=(TPZVec<long> *this,TPZVec<long> *rval)

{
  long *plVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    if (this->fStore != (long *)0x0) {
      operator_delete__(this->fStore);
    }
    if (rval->fNAlloc == 0) {
      uVar5 = this->fNElements;
      uVar4 = 0;
      plVar2 = (long *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
      this->fStore = plVar2;
      plVar1 = rval->fStore;
      uVar3 = 0;
      if (0 < (long)uVar5) {
        uVar3 = uVar5;
      }
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        plVar2[uVar4] = plVar1[uVar4];
      }
    }
    else {
      this->fStore = rval->fStore;
      uVar5 = this->fNElements;
    }
    this->fNAlloc = uVar5;
    rval->fStore = (long *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}